

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge,uchar *data)

{
  int iVar1;
  
  iVar1 = secp256k1_memcmp_var(data,"",0x40);
  if (iVar1 != 0) {
    secp256k1_ge_from_bytes(ge,data);
    return;
  }
  ge->infinity = 1;
  (ge->x).n[0] = 0;
  (ge->x).n[1] = 0;
  (ge->x).n[2] = 0;
  (ge->x).n[3] = 0;
  (ge->x).n[4] = 0;
  (ge->y).n[0] = 0;
  (ge->y).n[1] = 0;
  (ge->y).n[2] = 0;
  (ge->y).n[3] = 0;
  (ge->y).n[4] = 0;
  return;
}

Assistant:

static void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge, const unsigned char *data) {
    static const unsigned char zeros[64] = { 0 };
    if (secp256k1_memcmp_var(data, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
    } else {
        secp256k1_ge_from_bytes(ge, data);
    }
}